

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O2

int Curl_closesocket(Curl_easy *data,connectdata *conn,curl_socket_t sock)

{
  uint uVar1;
  int iVar2;
  
  if (conn != (connectdata *)0x0) {
    if (conn->fclosesocket != (curl_closesocket_callback)0x0) {
      if ((conn->sock[1] != sock) ||
         (uVar1 = *(uint *)&(conn->bits).field_0x4, (uVar1 >> 0x1d & 1) == 0)) {
        Curl_multi_closed(data,sock);
        Curl_set_in_callback(data,true);
        iVar2 = (*conn->fclosesocket)(conn->closesocket_client,sock);
        Curl_set_in_callback(data,false);
        return iVar2;
      }
      *(uint *)&(conn->bits).field_0x4 = uVar1 & 0xdfffffff;
    }
    Curl_multi_closed(data,sock);
  }
  close(sock);
  return 0;
}

Assistant:

int Curl_closesocket(struct Curl_easy *data, struct connectdata *conn,
                     curl_socket_t sock)
{
  if(conn && conn->fclosesocket) {
    if((sock == conn->sock[SECONDARYSOCKET]) && conn->bits.sock_accepted)
      /* if this socket matches the second socket, and that was created with
         accept, then we MUST NOT call the callback but clear the accepted
         status */
      conn->bits.sock_accepted = FALSE;
    else {
      int rc;
      Curl_multi_closed(data, sock);
      Curl_set_in_callback(data, true);
      rc = conn->fclosesocket(conn->closesocket_client, sock);
      Curl_set_in_callback(data, false);
      return rc;
    }
  }

  if(conn)
    /* tell the multi-socket code about this */
    Curl_multi_closed(data, sock);

  sclose(sock);

  return 0;
}